

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O0

RGB __thiscall pbrt::MIPMap::Bilerp<pbrt::RGB>(MIPMap *this,int level,Point2f st)

{
  undefined8 uVar1;
  RGB RVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  Float *pFVar6;
  int in_ESI;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_RDI;
  Float FVar7;
  undefined1 in_ZMM0 [64];
  int in_stack_0000001c;
  Image *in_stack_00000020;
  WrapMode2D in_stack_00000028;
  Tuple2<pbrt::Point2,_float> in_stack_00000030;
  Float v;
  int vb;
  int va;
  int c;
  RGB rgb;
  undefined8 in_stack_ffffffffffffff58;
  WrapMode w;
  WrapMode2D *in_stack_ffffffffffffff60;
  char (*in_stack_ffffffffffffff90) [37];
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  LogLevel in_stack_ffffffffffffffb4;
  int iVar8;
  LogLevel in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *args_3;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar9;
  undefined4 uVar10;
  Float in_stack_ffffffffffffffec;
  Float FStack_10;
  Float local_c;
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  uVar9 = (undefined4)uVar1;
  uVar10 = (undefined4)((ulong)uVar1 >> 0x20);
  if ((in_ESI < 0) ||
     (uVar4 = (ulong)in_ESI, args_3 = in_RDI,
     sVar5 = pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::size(in_RDI)
     , sVar5 <= uVar4)) {
    LogFatal<char_const(&)[37]>
              (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90);
  }
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
            (in_RDI,(long)in_ESI);
  iVar3 = Image::NChannels((Image *)0x8d4779);
  if (iVar3 != 3) {
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
              (in_RDI,(long)in_ESI);
    iVar3 = Image::NChannels((Image *)0x8d4798);
    w = (WrapMode)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if (iVar3 != 4) {
      iVar8 = 1;
      pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
                (in_RDI,(long)in_ESI);
      iVar3 = Image::NChannels((Image *)0x8d488d);
      if (iVar8 != iVar3) {
        LogFatal<char_const(&)[2],char_const(&)[27],char_const(&)[2],int&,char_const(&)[27],int&>
                  (in_stack_ffffffffffffffc4,(char *)CONCAT44(iVar8,iVar3),in_stack_ffffffffffffffb4
                   ,in_stack_ffffffffffffffa8,
                   (char (*) [2])CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (char (*) [27])CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (char (*) [2])CONCAT44(in_ESI,in_stack_ffffffffffffffd0),(int *)args_3,
                   (char (*) [27])CONCAT44(uVar9,in_stack_ffffffffffffffe0),
                   (int *)CONCAT44(in_stack_ffffffffffffffec,uVar10));
      }
      pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
                (in_RDI,(long)in_ESI);
      WrapMode2D::WrapMode2D(in_stack_ffffffffffffff60,w);
      FVar7 = Image::BilerpChannel
                        (in_stack_00000020,(Point2f)in_stack_00000030,in_stack_0000001c,
                         in_stack_00000028);
      RGB::RGB((RGB *)&stack0xffffffffffffffec,FVar7,FVar7,FVar7);
      goto LAB_008d4960;
    }
  }
  RGB::RGB((RGB *)&stack0xffffffffffffffec);
  for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
              (in_RDI,(long)in_ESI);
    WrapMode2D::WrapMode2D
              (in_stack_ffffffffffffff60,(WrapMode)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    FVar7 = Image::BilerpChannel
                      (in_stack_00000020,(Point2f)in_stack_00000030,in_stack_0000001c,
                       in_stack_00000028);
    pFVar6 = RGB::operator[]((RGB *)&stack0xffffffffffffffec,iVar3);
    *pFVar6 = FVar7;
  }
LAB_008d4960:
  RVar2.g = FStack_10;
  RVar2.r = in_stack_ffffffffffffffec;
  RVar2.b = local_c;
  return RVar2;
}

Assistant:

RGB MIPMap::Bilerp(int level, Point2f st) const {
    CHECK(level >= 0 && level < pyramid.size());
    if (pyramid[level].NChannels() == 3 || pyramid[level].NChannels() == 4) {
        RGB rgb;
        for (int c = 0; c < 3; ++c)
            rgb[c] = pyramid[level].BilerpChannel(st, c, wrapMode);
        return rgb;
    } else {
        CHECK_EQ(1, pyramid[level].NChannels());
        Float v = pyramid[level].BilerpChannel(st, 0, wrapMode);
        return RGB(v, v, v);
    }
}